

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v2.cpp
# Opt level: O0

int __thiscall
LASwriteItemCompressed_POINT10_v2::init(LASwriteItemCompressed_POINT10_v2 *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *ctx_00;
  uint local_24;
  U32 i;
  U32 *context_local;
  U8 *item_local;
  LASwriteItemCompressed_POINT10_v2 *this_local;
  
  ctx_00 = ctx;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    StreamingMedian5::init(this->last_x_diff_median5 + local_24,ctx_00);
    StreamingMedian5::init(this->last_y_diff_median5 + local_24,ctx_00);
    this->last_intensity[local_24] = 0;
    this->last_height[local_24 >> 1] = 0;
  }
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_changed_values,(U32 *)0x0);
  IntegerCompressor::initCompressor(this->ic_intensity);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_scan_angle_rank[0],(U32 *)0x0);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_scan_angle_rank[1],(U32 *)0x0);
  IntegerCompressor::initCompressor(this->ic_point_source_ID);
  for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
    if (this->m_bit_byte[local_24] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->m_bit_byte[local_24],(U32 *)0x0);
    }
    if (this->m_classification[local_24] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->m_classification[local_24],(U32 *)0x0);
    }
    if (this->m_user_data[local_24] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->m_user_data[local_24],(U32 *)0x0);
    }
  }
  IntegerCompressor::initCompressor(this->ic_dx);
  IntegerCompressor::initCompressor(this->ic_dy);
  IntegerCompressor::initCompressor(this->ic_z);
  *(undefined8 *)this->last_item = *(undefined8 *)ctx;
  *(undefined8 *)(this->last_item + 8) = *(undefined8 *)(ctx + 8);
  *(undefined4 *)(this->last_item + 0x10) = *(undefined4 *)(ctx + 0x10);
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

BOOL LASwriteItemCompressed_POINT10_v2::init(const U8* item, U32& context)
{
  U32 i;

  /* init state */
  for (i=0; i < 16; i++)
  {
    last_x_diff_median5[i].init();
    last_y_diff_median5[i].init();
    last_intensity[i] = 0;
    last_height[i/2] = 0;
  }

  /* init models and integer compressors */
  enc->initSymbolModel(m_changed_values);
  ic_intensity->initCompressor();
  enc->initSymbolModel(m_scan_angle_rank[0]);
  enc->initSymbolModel(m_scan_angle_rank[1]);
  ic_point_source_ID->initCompressor();
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) enc->initSymbolModel(m_bit_byte[i]);
    if (m_classification[i]) enc->initSymbolModel(m_classification[i]);
    if (m_user_data[i]) enc->initSymbolModel(m_user_data[i]);
  }
  ic_dx->initCompressor();
  ic_dy->initCompressor();
  ic_z->initCompressor();

  /* init last item */
  memcpy(last_item, item, 20);

  return TRUE;
}